

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chase.cpp
# Opt level: O1

bool move_monst(MonsterThing *tp)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = tp->turn_delay;
  tp->turn_delay = iVar1 + -1;
  if (iVar1 < 2) {
    tp->turn_delay = ((short)tp->flags < 0) + 1;
    bVar2 = do_chase(tp);
    if (bVar2) {
      return true;
    }
  }
  if (((tp->flags & 0x40) != 0) && (bVar2 = do_chase(tp), bVar2)) {
    return true;
  }
  return false;
}

Assistant:

bool move_monst(MonsterThing *tp)
{
    tp->turn_delay--;
    if (tp->turn_delay <= 0)
    {
        tp->turn_delay = 1;
        if (on(*tp, ISSLOW))
            tp->turn_delay = 2;
        if (do_chase(tp))
            return true;
    }
    if (on(*tp, ISHASTE))
        if (do_chase(tp))
            return true;
    return false;
}